

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O3

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::CreatePivotStatement
          (Transformer *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  MultiStatement *this_00;
  pointer pCVar2;
  pointer pMVar3;
  ParserException *this_01;
  pointer pPVar4;
  _Hash_node_base *in_RDX;
  CreatePivotEntry *entry;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> this_02;
  CreatePivotEntry *local_90;
  _Head_base<0UL,_duckdb::MultiStatement_*,_false> local_88;
  undefined1 local_80 [32];
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> local_60;
  __node_base local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  entry = (CreatePivotEntry *)statement;
  local_60._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)this;
  local_58._M_nxt = in_RDX;
  this_00 = (MultiStatement *)operator_new(0x90);
  MultiStatement::MultiStatement(this_00);
  this_02._M_head_impl =
       statement[0x12].
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  _Var1._M_head_impl =
       statement[0x13].
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  local_88._M_head_impl = this_00;
  if (this_02._M_head_impl != _Var1._M_head_impl) {
    do {
      pCVar2 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
               ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                             *)this_02._M_head_impl);
      if (pCVar2->has_parameters == true) {
        this_01 = (ParserException *)__cxa_allocate_exception(0x10);
        local_80._0_8_ = local_80 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,
                   "PIVOT statements with pivot elements extracted from the data cannot have parameters in their source.\nIn order to use parameters the PIVOT values must be manually specified, e.g.:\nPIVOT ... ON %s IN (val1, val2, ...)"
                   ,"");
        pCVar2 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                 ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                               *)this_02._M_head_impl);
        pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&pCVar2->column);
        (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar4);
        ParserException::ParserException<std::__cxx11::string>(this_01,(string *)local_80,&local_50)
        ;
        __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pMVar3 = unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>
               ::operator->((unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>
                             *)&local_88);
      local_90 = (CreatePivotEntry *)(this_02._M_head_impl)->_vptr_SQLStatement;
      (this_02._M_head_impl)->_vptr_SQLStatement = (_func_int **)0x0;
      GenerateCreateEnumStmt
                ((Transformer *)local_80,
                 (unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                  *)entry);
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
                ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
                  *)&pMVar3->statements,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)local_80);
      if ((Transformer *)local_80._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_80._0_8_ + 8))();
      }
      local_80._0_8_ = (Transformer *)0x0;
      entry = local_90;
      if (local_90 != (CreatePivotEntry *)0x0) {
        ::std::default_delete<duckdb::Transformer::CreatePivotEntry>::operator()
                  ((default_delete<duckdb::Transformer::CreatePivotEntry> *)&local_90,local_90);
        entry = local_90;
      }
      local_90 = (CreatePivotEntry *)0x0;
      this_02._M_head_impl = (SQLStatement *)&(this_02._M_head_impl)->type;
    } while (this_02._M_head_impl != _Var1._M_head_impl);
  }
  pMVar3 = unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>::
           operator->((unique_ptr<duckdb::MultiStatement,_std::default_delete<duckdb::MultiStatement>,_true>
                       *)&local_88);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
            ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
              *)&pMVar3->statements,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             local_58._M_nxt);
  *(MultiStatement **)
   local_60._M_t.
   super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
   super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = local_88._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (_Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
         local_60._M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SQLStatement> Transformer::CreatePivotStatement(unique_ptr<SQLStatement> statement) {
	auto result = make_uniq<MultiStatement>();
	for (auto &pivot : pivot_entries) {
		if (pivot->has_parameters) {
			throw ParserException(
			    "PIVOT statements with pivot elements extracted from the data cannot have parameters in their source.\n"
			    "In order to use parameters the PIVOT values must be manually specified, e.g.:\n"
			    "PIVOT ... ON %s IN (val1, val2, ...)",
			    pivot->column->ToString());
		}
		result->statements.push_back(GenerateCreateEnumStmt(std::move(pivot)));
	}
	result->statements.push_back(std::move(statement));
	// FIXME: drop the types again!?
	//	for(auto &pivot : pivot_entries) {
	//		result->statements.push_back(GenerateDropEnumStmt(std::move(pivot->enum_name)));
	//	}
	return std::move(result);
}